

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

QDate __thiscall
QDate::fromString(QDate *this,QString *string,QStringView format,int baseYear,QCalendar cal)

{
  bool bVar1;
  void *pvVar2;
  undefined4 in_register_00000084;
  QCalendar cal_00;
  long in_FS_OFFSET;
  QStringView newFormat;
  QLocale local_e0;
  QDateTimeParser dt;
  QDate local_40;
  long local_38;
  
  cal_00.d_ptr._4_4_ = in_register_00000084;
  cal_00.d_ptr._0_4_ = baseYear;
  newFormat.m_data = (storage_type_conflict *)format.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.jd = -0x8000000000000000;
  memset(&dt,0xaa,0x98);
  pvVar2 = (void *)0xe;
  QDateTimeParser::QDateTimeParser(&dt,QDate,FromString,cal_00);
  QLocale::c(&local_e0,pvVar2);
  QLocale::operator=(&dt.defaultLocale,&local_e0);
  QLocale::~QLocale(&local_e0);
  newFormat.m_size = (qsizetype)string;
  bVar1 = QDateTimeParser::parseFormat(&dt,newFormat);
  if (bVar1) {
    QDateTimeParser::fromString(&dt,(QString *)this,&local_40,(QTime *)0x0,(int)format.m_data);
  }
  QDateTimeParser::~QDateTimeParser(&dt);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDate)local_40.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QDate::fromString(const QString &string, QStringView format, int baseYear, QCalendar cal)
{
    QDate date;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QDate, QDateTimeParser::FromString, cal);
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format))
        dt.fromString(string, &date, nullptr, baseYear);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
    Q_UNUSED(baseYear);
    Q_UNUSED(cal);
#endif
    return date;
}